

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CShInstruction.h
# Opt level: O2

void __thiscall ShImmediateData::reset(ShImmediateData *this)

{
  Expression local_18;
  
  (this->primary).type = None;
  if ((this->primary).expression.expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_18.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_18.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_18.constExpression = true;
    local_18._17_7_ = 0;
    Expression::operator=(&(this->primary).expression,&local_18);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_18.expression.
                super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void reset()
	{
		primary.type = ShImmediateType::None;
		if (primary.expression.isLoaded())
			primary.expression = Expression();
	}